

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void lowbd_fwd_txfm2d_64x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 auVar1 [32];
  int j_1;
  __m128i *buf;
  __m256i bufB [64];
  __m256i bufA [64];
  int i_1;
  int j;
  int i;
  int height_div16;
  int width_div16;
  transform_1d_avx2_conflict1 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i buf1 [256];
  __m256i buf0 [64];
  TX_SIZE tx_size;
  int in_stack_ffffffffffffc724;
  __m256i *in_stack_ffffffffffffc728;
  int in_stack_ffffffffffffc734;
  int iVar2;
  int16_t *in_stack_ffffffffffffc738;
  undefined1 *puVar3;
  __m256i *in_stack_ffffffffffffc740;
  __m256i *in_stack_ffffffffffffc748;
  int32_t *in_stack_ffffffffffffc750;
  int in_stack_ffffffffffffc760;
  int in_stack_ffffffffffffc764;
  __m256i *in_stack_ffffffffffffc768;
  __m256i *in_stack_ffffffffffffc918;
  __m256i *in_stack_ffffffffffffc920;
  undefined1 local_30c0 [2052];
  int local_28bc;
  int local_28b8;
  int local_28b4;
  undefined4 local_28b0;
  undefined4 local_28ac;
  code *local_28a8;
  undefined4 local_28a0;
  undefined4 local_289c;
  int local_2898;
  int local_2894;
  int local_2890;
  int local_288c;
  int8_t *local_2888;
  undefined1 local_2880 [223];
  int8_t in_stack_ffffffffffffd85f;
  __m256i *in_stack_ffffffffffffd860;
  __m256i *in_stack_ffffffffffffd868;
  int8_t in_stack_ffffffffffffd907;
  __m256i *in_stack_ffffffffffffd908;
  __m256i *in_stack_ffffffffffffd910;
  
  local_2888 = av1_fwd_txfm_shift_ls[4];
  local_288c = get_txw_idx('\x04');
  local_2890 = get_txh_idx('\x04');
  local_2894 = (int)av1_fwd_cos_bit_col[local_288c][local_2890];
  local_2898 = (int)av1_fwd_cos_bit_row[local_288c][local_2890];
  local_289c = 0x40;
  local_28a0 = 0x40;
  local_28a8 = fdct16x64_new_avx2;
  local_28ac = 4;
  local_28b0 = 4;
  for (local_28b4 = 0; local_28b4 < 4; local_28b4 = local_28b4 + 1) {
    load_buffer_16bit_to_16bit_avx2
              (in_stack_ffffffffffffc738,in_stack_ffffffffffffc734,in_stack_ffffffffffffc728,
               in_stack_ffffffffffffc724);
    round_shift_16bit_w16_avx2
              (in_stack_ffffffffffffc768,in_stack_ffffffffffffc764,in_stack_ffffffffffffc760);
    fdct16x64_new_avx2(in_stack_ffffffffffffd868,in_stack_ffffffffffffd860,in_stack_ffffffffffffd85f
                      );
    round_shift_16bit_w16_avx2
              (in_stack_ffffffffffffc768,in_stack_ffffffffffffc764,in_stack_ffffffffffffc760);
    for (local_28b8 = 0; local_28b8 < 2; local_28b8 = local_28b8 + 1) {
      transpose_16bit_16x16_avx2(in_stack_ffffffffffffc920,in_stack_ffffffffffffc918);
    }
  }
  for (local_28bc = 0; local_28bc < 2; local_28bc = local_28bc + 1) {
    puVar3 = local_2880 + (long)(local_28bc << 6) * 0x20;
    for (iVar2 = 0; iVar2 < 0x40; iVar2 = iVar2 + 1) {
      auVar1 = vpmovsxwd_avx2(*(undefined1 (*) [16])(puVar3 + (long)(iVar2 << 1) * 0x10));
      *(undefined1 (*) [32])(local_30c0 + (long)iVar2 * 0x20) = auVar1;
      auVar1 = vpmovsxwd_avx2(*(undefined1 (*) [16])(puVar3 + (long)(iVar2 * 2 + 1) * 0x10));
      *(undefined1 (*) [32])(&stack0xffffffffffffc740 + (long)iVar2 * 0x20) = auVar1;
    }
    fdct64_new_avx2(in_stack_ffffffffffffd910,in_stack_ffffffffffffd908,in_stack_ffffffffffffd907);
    fdct64_new_avx2(in_stack_ffffffffffffd910,in_stack_ffffffffffffd908,in_stack_ffffffffffffd907);
    round_shift_array_32_avx2
              (in_stack_ffffffffffffc748,in_stack_ffffffffffffc740,(int)((ulong)puVar3 >> 0x20),
               (int)puVar3);
    round_shift_array_32_avx2
              (in_stack_ffffffffffffc748,in_stack_ffffffffffffc740,(int)((ulong)puVar3 >> 0x20),
               (int)puVar3);
    store_output_32bit_w16
              (in_stack_ffffffffffffc750,in_stack_ffffffffffffc748,in_stack_ffffffffffffc740,
               (int)((ulong)puVar3 >> 0x20),(int)puVar3);
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x64_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m256i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x64_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(2, height_div16); ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i bufA[64];
    __m256i bufB[64];
    __m128i *buf = (__m128i *)(buf1 + width * i);
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm256_cvtepi16_epi32(buf[j * 2]);
      bufB[j] = _mm256_cvtepi16_epi32(buf[j * 2 + 1]);
    }
    fdct64_new_avx2(bufA, bufA, cos_bit_row);
    fdct64_new_avx2(bufB, bufB, cos_bit_row);
    round_shift_array_32_avx2(bufA, bufA, 32, -shift[2]);
    round_shift_array_32_avx2(bufB, bufB, 32, -shift[2]);
    store_output_32bit_w16(output + i * 16, bufA, bufB, 32, 32);
  }
}